

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::Descriptor::DebugString
          (Descriptor *this,int depth,string *contents,DebugStringOptions *debug_string_options,
          bool include_opening_clause)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Type TVar4;
  int iVar5;
  MessageOptions *pMVar6;
  string *psVar7;
  FileDescriptor *this_00;
  DescriptorPool *pool;
  FieldDescriptor *pFVar8;
  size_type sVar9;
  Descriptor *pDVar10;
  EnumDescriptor *this_01;
  OneofDescriptor *pOVar11;
  FieldDescriptor *pFVar12;
  ExtensionRange *pEVar13;
  long lVar14;
  pair<std::_Rb_tree_const_iterator<const_google::protobuf::Descriptor_*>,_bool> pVar15;
  SubstituteArg local_1858;
  SubstituteArg local_1828;
  SubstituteArg local_17f8;
  SubstituteArg local_17c8;
  SubstituteArg local_1798;
  SubstituteArg local_1768;
  SubstituteArg local_1738;
  SubstituteArg local_1708;
  SubstituteArg local_16d8;
  SubstituteArg local_16a8;
  SubstituteArg local_1678;
  SubstituteArg local_1648;
  SubstituteArg local_1618;
  SubstituteArg local_15e8;
  SubstituteArg local_15b8;
  SubstituteArg local_1588;
  SubstituteArg local_1558;
  SubstituteArg local_1528;
  SubstituteArg local_14f8;
  string local_14c8;
  SubstituteArg local_14a8;
  int local_1474;
  undefined1 local_1470 [4];
  int i_8;
  SubstituteArg local_1440;
  SubstituteArg local_1410;
  SubstituteArg local_13e0;
  SubstituteArg local_13b0;
  SubstituteArg local_1380;
  SubstituteArg local_1350;
  SubstituteArg local_1320;
  SubstituteArg local_12f0;
  SubstituteArg local_12c0;
  SubstituteArg local_1290;
  SubstituteArg local_1260;
  SubstituteArg local_1230;
  SubstituteArg local_1200;
  SubstituteArg local_11d0;
  SubstituteArg local_11a0;
  SubstituteArg local_1170;
  SubstituteArg local_1140;
  SubstituteArg local_1110;
  SubstituteArg local_10e0;
  SubstituteArg local_10b0;
  SubstituteArg local_1080;
  SubstituteArg local_1050;
  SubstituteArg local_1020;
  SubstituteArg local_ff0;
  SubstituteArg local_fc0;
  SubstituteArg local_f90;
  SubstituteArg local_f60;
  SubstituteArg local_f30;
  SubstituteArg local_f00;
  SubstituteArg local_ed0;
  SubstituteArg local_ea0;
  SubstituteArg local_e70;
  SubstituteArg local_e40;
  SubstituteArg local_e10;
  SubstituteArg local_de0;
  SubstituteArg local_db0;
  SubstituteArg local_d80;
  SubstituteArg local_d50;
  SubstituteArg local_d20;
  ReservedRange *local_cf0;
  ReservedRange *range;
  undefined1 local_ce0 [4];
  int i_7;
  SubstituteArg local_cb0;
  SubstituteArg local_c80;
  SubstituteArg local_c50;
  SubstituteArg local_c20;
  SubstituteArg local_bf0;
  SubstituteArg local_bc0;
  SubstituteArg local_b90;
  SubstituteArg local_b60;
  SubstituteArg local_b30;
  SubstituteArg local_b00;
  SubstituteArg local_ad0;
  SubstituteArg local_aa0;
  SubstituteArg local_a70;
  SubstituteArg local_a40;
  SubstituteArg local_a10;
  SubstituteArg local_9e0;
  SubstituteArg local_9b0;
  SubstituteArg local_980;
  SubstituteArg local_950;
  SubstituteArg local_920;
  SubstituteArg local_8f0;
  SubstituteArg local_8c0;
  SubstituteArg local_890;
  SubstituteArg local_860;
  SubstituteArg local_830;
  SubstituteArg local_800;
  SubstituteArg local_7d0;
  SubstituteArg local_7a0;
  SubstituteArg local_770;
  SubstituteArg local_740;
  SubstituteArg local_710;
  SubstituteArg local_6e0;
  SubstituteArg local_6b0;
  SubstituteArg local_680;
  SubstituteArg local_650;
  SubstituteArg local_620;
  SubstituteArg local_5f0;
  SubstituteArg local_5c0;
  SubstituteArg local_590;
  int local_55c;
  Descriptor *pDStack_558;
  int i_6;
  Descriptor *containing_type;
  SubstituteArg local_520;
  SubstituteArg local_4f0;
  SubstituteArg local_4c0;
  SubstituteArg local_490;
  SubstituteArg local_460;
  SubstituteArg local_430;
  SubstituteArg local_400;
  SubstituteArg local_3d0;
  SubstituteArg local_3a0;
  int local_36c;
  int local_368;
  int i_5;
  int i_4;
  int i_3;
  int local_354;
  _Rb_tree_const_iterator<const_google::protobuf::Descriptor_*> _Stack_350;
  int i_2;
  undefined1 local_348;
  Descriptor *local_340;
  int local_334;
  _Rb_tree_const_iterator<const_google::protobuf::Descriptor_*> _Stack_330;
  int i_1;
  undefined1 local_328;
  Descriptor *local_320;
  int local_314;
  undefined1 local_310 [4];
  int i;
  set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
  groups;
  SubstituteArg local_2b0;
  SubstituteArg local_280;
  SubstituteArg local_250;
  SubstituteArg local_220;
  SubstituteArg local_1f0;
  SubstituteArg local_1c0;
  SubstituteArg local_190;
  SubstituteArg local_160;
  SubstituteArg local_130;
  undefined1 local_100 [8];
  SourceLocationCommentPrinter comment_printer;
  allocator local_51;
  undefined1 local_50 [8];
  string prefix;
  bool include_opening_clause_local;
  DebugStringOptions *debug_string_options_local;
  string *contents_local;
  int depth_local;
  Descriptor *this_local;
  
  prefix.field_2._M_local_buf[0xf] = include_opening_clause;
  pMVar6 = options(this);
  bVar1 = MessageOptions::map_entry(pMVar6);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_50,(long)(depth * 2),' ',&local_51);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    iVar2 = depth + 1;
    anon_unknown_1::SourceLocationCommentPrinter::
    SourceLocationCommentPrinter<google::protobuf::Descriptor>
              ((SourceLocationCommentPrinter *)local_100,this,(string *)local_50,
               debug_string_options);
    anon_unknown_1::SourceLocationCommentPrinter::AddPreComment
              ((SourceLocationCommentPrinter *)local_100,contents);
    if ((prefix.field_2._M_local_buf[0xf] & 1U) != 0) {
      strings::internal::SubstituteArg::SubstituteArg(&local_130,(string *)local_50);
      psVar7 = name_abi_cxx11_(this);
      strings::internal::SubstituteArg::SubstituteArg(&local_160,psVar7);
      strings::internal::SubstituteArg::SubstituteArg(&local_190);
      strings::internal::SubstituteArg::SubstituteArg(&local_1c0);
      strings::internal::SubstituteArg::SubstituteArg(&local_1f0);
      strings::internal::SubstituteArg::SubstituteArg(&local_220);
      strings::internal::SubstituteArg::SubstituteArg(&local_250);
      strings::internal::SubstituteArg::SubstituteArg(&local_280);
      strings::internal::SubstituteArg::SubstituteArg(&local_2b0);
      strings::internal::SubstituteArg::SubstituteArg
                ((SubstituteArg *)&groups._M_t._M_impl.super__Rb_tree_header._M_node_count);
      strings::SubstituteAndAppend
                (contents,"$0message $1",&local_130,&local_160,&local_190,&local_1c0,&local_1f0,
                 &local_220,&local_250,&local_280,&local_2b0,
                 (SubstituteArg *)&groups._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
    std::__cxx11::string::append((char *)contents);
    pMVar6 = options(this);
    this_00 = file(this);
    pool = FileDescriptor::pool(this_00);
    anon_unknown_1::FormatLineOptions(iVar2,&pMVar6->super_Message,pool,contents);
    std::
    set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
    ::set((set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
           *)local_310);
    for (local_314 = 0; iVar5 = local_314, iVar3 = field_count(this), iVar5 < iVar3;
        local_314 = local_314 + 1) {
      pFVar8 = field(this,local_314);
      TVar4 = FieldDescriptor::type(pFVar8);
      if (TVar4 == TYPE_GROUP) {
        pFVar8 = field(this,local_314);
        local_320 = FieldDescriptor::message_type(pFVar8);
        pVar15 = std::
                 set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                 ::insert((set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                           *)local_310,&local_320);
        _Stack_330 = pVar15.first._M_node;
        local_328 = pVar15.second;
      }
    }
    for (local_334 = 0; iVar5 = local_334, iVar3 = extension_count(this), iVar5 < iVar3;
        local_334 = local_334 + 1) {
      pFVar8 = extension(this,local_334);
      TVar4 = FieldDescriptor::type(pFVar8);
      if (TVar4 == TYPE_GROUP) {
        pFVar8 = extension(this,local_334);
        local_340 = FieldDescriptor::message_type(pFVar8);
        pVar15 = std::
                 set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                 ::insert((set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                           *)local_310,&local_340);
        _Stack_350 = pVar15.first._M_node;
        local_348 = pVar15.second;
      }
    }
    for (local_354 = 0; iVar5 = local_354, iVar3 = nested_type_count(this), iVar5 < iVar3;
        local_354 = local_354 + 1) {
      _i_4 = nested_type(this,local_354);
      sVar9 = std::
              set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
              ::count((set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                       *)local_310,(key_type *)&i_4);
      if (sVar9 == 0) {
        pDVar10 = nested_type(this,local_354);
        DebugString(pDVar10,iVar2,contents,debug_string_options,true);
      }
    }
    for (i_5 = 0; iVar5 = i_5, iVar3 = enum_type_count(this), iVar5 < iVar3; i_5 = i_5 + 1) {
      this_01 = enum_type(this,i_5);
      EnumDescriptor::DebugString(this_01,iVar2,contents,debug_string_options);
    }
    for (local_368 = 0; iVar5 = local_368, iVar3 = field_count(this), iVar5 < iVar3;
        local_368 = local_368 + 1) {
      pFVar8 = field(this,local_368);
      pOVar11 = FieldDescriptor::real_containing_oneof(pFVar8);
      if (pOVar11 == (OneofDescriptor *)0x0) {
        pFVar8 = field(this,local_368);
        FieldDescriptor::DebugString(pFVar8,iVar2,contents,debug_string_options);
      }
      else {
        pFVar8 = field(this,local_368);
        pOVar11 = FieldDescriptor::containing_oneof(pFVar8);
        pFVar8 = OneofDescriptor::field(pOVar11,0);
        pFVar12 = field(this,local_368);
        if (pFVar8 == pFVar12) {
          pFVar8 = field(this,local_368);
          pOVar11 = FieldDescriptor::containing_oneof(pFVar8);
          OneofDescriptor::DebugString(pOVar11,iVar2,contents,debug_string_options);
        }
      }
    }
    for (local_36c = 0; iVar2 = local_36c, iVar5 = extension_range_count(this), iVar2 < iVar5;
        local_36c = local_36c + 1) {
      strings::internal::SubstituteArg::SubstituteArg(&local_3a0,(string *)local_50);
      pEVar13 = extension_range(this,local_36c);
      strings::internal::SubstituteArg::SubstituteArg(&local_3d0,pEVar13->start);
      pEVar13 = extension_range(this,local_36c);
      strings::internal::SubstituteArg::SubstituteArg(&local_400,pEVar13->end + -1);
      strings::internal::SubstituteArg::SubstituteArg(&local_430);
      strings::internal::SubstituteArg::SubstituteArg(&local_460);
      strings::internal::SubstituteArg::SubstituteArg(&local_490);
      strings::internal::SubstituteArg::SubstituteArg(&local_4c0);
      strings::internal::SubstituteArg::SubstituteArg(&local_4f0);
      strings::internal::SubstituteArg::SubstituteArg(&local_520);
      strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)&containing_type);
      strings::SubstituteAndAppend
                (contents,"$0  extensions $1 to $2;\n",&local_3a0,&local_3d0,&local_400,&local_430,
                 &local_460,&local_490,&local_4c0,&local_4f0,&local_520,
                 (SubstituteArg *)&containing_type);
    }
    pDStack_558 = (Descriptor *)0x0;
    for (local_55c = 0; iVar2 = local_55c, iVar5 = extension_count(this), iVar2 < iVar5;
        local_55c = local_55c + 1) {
      pFVar8 = extension(this,local_55c);
      pDVar10 = FieldDescriptor::containing_type(pFVar8);
      if (pDVar10 != pDStack_558) {
        if (0 < local_55c) {
          strings::internal::SubstituteArg::SubstituteArg(&local_590,(string *)local_50);
          strings::internal::SubstituteArg::SubstituteArg(&local_5c0);
          strings::internal::SubstituteArg::SubstituteArg(&local_5f0);
          strings::internal::SubstituteArg::SubstituteArg(&local_620);
          strings::internal::SubstituteArg::SubstituteArg(&local_650);
          strings::internal::SubstituteArg::SubstituteArg(&local_680);
          strings::internal::SubstituteArg::SubstituteArg(&local_6b0);
          strings::internal::SubstituteArg::SubstituteArg(&local_6e0);
          strings::internal::SubstituteArg::SubstituteArg(&local_710);
          strings::internal::SubstituteArg::SubstituteArg(&local_740);
          strings::SubstituteAndAppend
                    (contents,"$0  }\n",&local_590,&local_5c0,&local_5f0,&local_620,&local_650,
                     &local_680,&local_6b0,&local_6e0,&local_710,&local_740);
        }
        pFVar8 = extension(this,local_55c);
        pDStack_558 = FieldDescriptor::containing_type(pFVar8);
        strings::internal::SubstituteArg::SubstituteArg(&local_770,(string *)local_50);
        psVar7 = full_name_abi_cxx11_(pDStack_558);
        strings::internal::SubstituteArg::SubstituteArg(&local_7a0,psVar7);
        strings::internal::SubstituteArg::SubstituteArg(&local_7d0);
        strings::internal::SubstituteArg::SubstituteArg(&local_800);
        strings::internal::SubstituteArg::SubstituteArg(&local_830);
        strings::internal::SubstituteArg::SubstituteArg(&local_860);
        strings::internal::SubstituteArg::SubstituteArg(&local_890);
        strings::internal::SubstituteArg::SubstituteArg(&local_8c0);
        strings::internal::SubstituteArg::SubstituteArg(&local_8f0);
        strings::internal::SubstituteArg::SubstituteArg(&local_920);
        strings::SubstituteAndAppend
                  (contents,"$0  extend .$1 {\n",&local_770,&local_7a0,&local_7d0,&local_800,
                   &local_830,&local_860,&local_890,&local_8c0,&local_8f0,&local_920);
      }
      pFVar8 = extension(this,local_55c);
      FieldDescriptor::DebugString(pFVar8,depth + 2,contents,debug_string_options);
    }
    iVar2 = extension_count(this);
    if (0 < iVar2) {
      strings::internal::SubstituteArg::SubstituteArg(&local_950,(string *)local_50);
      strings::internal::SubstituteArg::SubstituteArg(&local_980);
      strings::internal::SubstituteArg::SubstituteArg(&local_9b0);
      strings::internal::SubstituteArg::SubstituteArg(&local_9e0);
      strings::internal::SubstituteArg::SubstituteArg(&local_a10);
      strings::internal::SubstituteArg::SubstituteArg(&local_a40);
      strings::internal::SubstituteArg::SubstituteArg(&local_a70);
      strings::internal::SubstituteArg::SubstituteArg(&local_aa0);
      strings::internal::SubstituteArg::SubstituteArg(&local_ad0);
      strings::internal::SubstituteArg::SubstituteArg(&local_b00);
      strings::SubstituteAndAppend
                (contents,"$0  }\n",&local_950,&local_980,&local_9b0,&local_9e0,&local_a10,
                 &local_a40,&local_a70,&local_aa0,&local_ad0,&local_b00);
    }
    iVar2 = reserved_range_count(this);
    if (0 < iVar2) {
      strings::internal::SubstituteArg::SubstituteArg(&local_b30,(string *)local_50);
      strings::internal::SubstituteArg::SubstituteArg(&local_b60);
      strings::internal::SubstituteArg::SubstituteArg(&local_b90);
      strings::internal::SubstituteArg::SubstituteArg(&local_bc0);
      strings::internal::SubstituteArg::SubstituteArg(&local_bf0);
      strings::internal::SubstituteArg::SubstituteArg(&local_c20);
      strings::internal::SubstituteArg::SubstituteArg(&local_c50);
      strings::internal::SubstituteArg::SubstituteArg(&local_c80);
      strings::internal::SubstituteArg::SubstituteArg(&local_cb0);
      strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)local_ce0);
      strings::SubstituteAndAppend
                (contents,"$0  reserved ",&local_b30,&local_b60,&local_b90,&local_bc0,&local_bf0,
                 &local_c20,&local_c50,&local_c80,&local_cb0,(SubstituteArg *)local_ce0);
      for (range._4_4_ = 0; iVar2 = range._4_4_, iVar5 = reserved_range_count(this), iVar2 < iVar5;
          range._4_4_ = range._4_4_ + 1) {
        local_cf0 = reserved_range(this,range._4_4_);
        if (local_cf0->end == local_cf0->start + 1) {
          strings::internal::SubstituteArg::SubstituteArg(&local_d20,local_cf0->start);
          strings::internal::SubstituteArg::SubstituteArg(&local_d50);
          strings::internal::SubstituteArg::SubstituteArg(&local_d80);
          strings::internal::SubstituteArg::SubstituteArg(&local_db0);
          strings::internal::SubstituteArg::SubstituteArg(&local_de0);
          strings::internal::SubstituteArg::SubstituteArg(&local_e10);
          strings::internal::SubstituteArg::SubstituteArg(&local_e40);
          strings::internal::SubstituteArg::SubstituteArg(&local_e70);
          strings::internal::SubstituteArg::SubstituteArg(&local_ea0);
          strings::internal::SubstituteArg::SubstituteArg(&local_ed0);
          strings::SubstituteAndAppend
                    (contents,"$0, ",&local_d20,&local_d50,&local_d80,&local_db0,&local_de0,
                     &local_e10,&local_e40,&local_e70,&local_ea0,&local_ed0);
        }
        else if (local_cf0->end < 0x20000000) {
          strings::internal::SubstituteArg::SubstituteArg(&local_10e0,local_cf0->start);
          strings::internal::SubstituteArg::SubstituteArg(&local_1110,local_cf0->end + -1);
          strings::internal::SubstituteArg::SubstituteArg(&local_1140);
          strings::internal::SubstituteArg::SubstituteArg(&local_1170);
          strings::internal::SubstituteArg::SubstituteArg(&local_11a0);
          strings::internal::SubstituteArg::SubstituteArg(&local_11d0);
          strings::internal::SubstituteArg::SubstituteArg(&local_1200);
          strings::internal::SubstituteArg::SubstituteArg(&local_1230);
          strings::internal::SubstituteArg::SubstituteArg(&local_1260);
          strings::internal::SubstituteArg::SubstituteArg(&local_1290);
          strings::SubstituteAndAppend
                    (contents,"$0 to $1, ",&local_10e0,&local_1110,&local_1140,&local_1170,
                     &local_11a0,&local_11d0,&local_1200,&local_1230,&local_1260,&local_1290);
        }
        else {
          strings::internal::SubstituteArg::SubstituteArg(&local_f00,local_cf0->start);
          strings::internal::SubstituteArg::SubstituteArg(&local_f30);
          strings::internal::SubstituteArg::SubstituteArg(&local_f60);
          strings::internal::SubstituteArg::SubstituteArg(&local_f90);
          strings::internal::SubstituteArg::SubstituteArg(&local_fc0);
          strings::internal::SubstituteArg::SubstituteArg(&local_ff0);
          strings::internal::SubstituteArg::SubstituteArg(&local_1020);
          strings::internal::SubstituteArg::SubstituteArg(&local_1050);
          strings::internal::SubstituteArg::SubstituteArg(&local_1080);
          strings::internal::SubstituteArg::SubstituteArg(&local_10b0);
          strings::SubstituteAndAppend
                    (contents,"$0 to max, ",&local_f00,&local_f30,&local_f60,&local_f90,&local_fc0,
                     &local_ff0,&local_1020,&local_1050,&local_1080,&local_10b0);
        }
      }
      lVar14 = std::__cxx11::string::size();
      std::__cxx11::string::replace((ulong)contents,lVar14 - 2,(char *)0x2);
    }
    iVar2 = reserved_name_count(this);
    if (0 < iVar2) {
      strings::internal::SubstituteArg::SubstituteArg(&local_12c0,(string *)local_50);
      strings::internal::SubstituteArg::SubstituteArg(&local_12f0);
      strings::internal::SubstituteArg::SubstituteArg(&local_1320);
      strings::internal::SubstituteArg::SubstituteArg(&local_1350);
      strings::internal::SubstituteArg::SubstituteArg(&local_1380);
      strings::internal::SubstituteArg::SubstituteArg(&local_13b0);
      strings::internal::SubstituteArg::SubstituteArg(&local_13e0);
      strings::internal::SubstituteArg::SubstituteArg(&local_1410);
      strings::internal::SubstituteArg::SubstituteArg(&local_1440);
      strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)local_1470);
      strings::SubstituteAndAppend
                (contents,"$0  reserved ",&local_12c0,&local_12f0,&local_1320,&local_1350,
                 &local_1380,&local_13b0,&local_13e0,&local_1410,&local_1440,
                 (SubstituteArg *)local_1470);
      for (local_1474 = 0; iVar2 = local_1474, iVar5 = reserved_name_count(this), iVar2 < iVar5;
          local_1474 = local_1474 + 1) {
        psVar7 = reserved_name_abi_cxx11_(this,local_1474);
        CEscape(&local_14c8,psVar7);
        strings::internal::SubstituteArg::SubstituteArg(&local_14a8,&local_14c8);
        strings::internal::SubstituteArg::SubstituteArg(&local_14f8);
        strings::internal::SubstituteArg::SubstituteArg(&local_1528);
        strings::internal::SubstituteArg::SubstituteArg(&local_1558);
        strings::internal::SubstituteArg::SubstituteArg(&local_1588);
        strings::internal::SubstituteArg::SubstituteArg(&local_15b8);
        strings::internal::SubstituteArg::SubstituteArg(&local_15e8);
        strings::internal::SubstituteArg::SubstituteArg(&local_1618);
        strings::internal::SubstituteArg::SubstituteArg(&local_1648);
        strings::internal::SubstituteArg::SubstituteArg(&local_1678);
        strings::SubstituteAndAppend
                  (contents,"\"$0\", ",&local_14a8,&local_14f8,&local_1528,&local_1558,&local_1588,
                   &local_15b8,&local_15e8,&local_1618,&local_1648,&local_1678);
        std::__cxx11::string::~string((string *)&local_14c8);
      }
      lVar14 = std::__cxx11::string::size();
      std::__cxx11::string::replace((ulong)contents,lVar14 - 2,(char *)0x2);
    }
    strings::internal::SubstituteArg::SubstituteArg(&local_16a8,(string *)local_50);
    strings::internal::SubstituteArg::SubstituteArg(&local_16d8);
    strings::internal::SubstituteArg::SubstituteArg(&local_1708);
    strings::internal::SubstituteArg::SubstituteArg(&local_1738);
    strings::internal::SubstituteArg::SubstituteArg(&local_1768);
    strings::internal::SubstituteArg::SubstituteArg(&local_1798);
    strings::internal::SubstituteArg::SubstituteArg(&local_17c8);
    strings::internal::SubstituteArg::SubstituteArg(&local_17f8);
    strings::internal::SubstituteArg::SubstituteArg(&local_1828);
    strings::internal::SubstituteArg::SubstituteArg(&local_1858);
    strings::SubstituteAndAppend
              (contents,"$0}\n",&local_16a8,&local_16d8,&local_1708,&local_1738,&local_1768,
               &local_1798,&local_17c8,&local_17f8,&local_1828,&local_1858);
    anon_unknown_1::SourceLocationCommentPrinter::AddPostComment
              ((SourceLocationCommentPrinter *)local_100,contents);
    std::
    set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
    ::~set((set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
            *)local_310);
    anon_unknown_1::SourceLocationCommentPrinter::~SourceLocationCommentPrinter
              ((SourceLocationCommentPrinter *)local_100);
    std::__cxx11::string::~string((string *)local_50);
  }
  return;
}

Assistant:

void Descriptor::DebugString(int depth, std::string* contents,
                             const DebugStringOptions& debug_string_options,
                             bool include_opening_clause) const {
  if (options().map_entry()) {
    // Do not generate debug string for auto-generated map-entry type.
    return;
  }
  std::string prefix(depth * 2, ' ');
  ++depth;

  SourceLocationCommentPrinter comment_printer(this, prefix,
                                               debug_string_options);
  comment_printer.AddPreComment(contents);

  if (include_opening_clause) {
    strings::SubstituteAndAppend(contents, "$0message $1", prefix, name());
  }
  contents->append(" {\n");

  FormatLineOptions(depth, options(), file()->pool(), contents);

  // Find all the 'group' types for fields and extensions; we will not output
  // their nested definitions (those will be done with their group field
  // descriptor).
  std::set<const Descriptor*> groups;
  for (int i = 0; i < field_count(); i++) {
    if (field(i)->type() == FieldDescriptor::TYPE_GROUP) {
      groups.insert(field(i)->message_type());
    }
  }
  for (int i = 0; i < extension_count(); i++) {
    if (extension(i)->type() == FieldDescriptor::TYPE_GROUP) {
      groups.insert(extension(i)->message_type());
    }
  }

  for (int i = 0; i < nested_type_count(); i++) {
    if (groups.count(nested_type(i)) == 0) {
      nested_type(i)->DebugString(depth, contents, debug_string_options,
                                  /* include_opening_clause */ true);
    }
  }
  for (int i = 0; i < enum_type_count(); i++) {
    enum_type(i)->DebugString(depth, contents, debug_string_options);
  }
  for (int i = 0; i < field_count(); i++) {
    if (field(i)->real_containing_oneof() == nullptr) {
      field(i)->DebugString(depth, contents, debug_string_options);
    } else if (field(i)->containing_oneof()->field(0) == field(i)) {
      // This is the first field in this oneof, so print the whole oneof.
      field(i)->containing_oneof()->DebugString(depth, contents,
                                                debug_string_options);
    }
  }

  for (int i = 0; i < extension_range_count(); i++) {
    strings::SubstituteAndAppend(contents, "$0  extensions $1 to $2;\n", prefix,
                              extension_range(i)->start,
                              extension_range(i)->end - 1);
  }

  // Group extensions by what they extend, so they can be printed out together.
  const Descriptor* containing_type = nullptr;
  for (int i = 0; i < extension_count(); i++) {
    if (extension(i)->containing_type() != containing_type) {
      if (i > 0) strings::SubstituteAndAppend(contents, "$0  }\n", prefix);
      containing_type = extension(i)->containing_type();
      strings::SubstituteAndAppend(contents, "$0  extend .$1 {\n", prefix,
                                containing_type->full_name());
    }
    extension(i)->DebugString(depth + 1, contents, debug_string_options);
  }
  if (extension_count() > 0)
    strings::SubstituteAndAppend(contents, "$0  }\n", prefix);

  if (reserved_range_count() > 0) {
    strings::SubstituteAndAppend(contents, "$0  reserved ", prefix);
    for (int i = 0; i < reserved_range_count(); i++) {
      const Descriptor::ReservedRange* range = reserved_range(i);
      if (range->end == range->start + 1) {
        strings::SubstituteAndAppend(contents, "$0, ", range->start);
      } else if (range->end > FieldDescriptor::kMaxNumber) {
        strings::SubstituteAndAppend(contents, "$0 to max, ", range->start);
      } else {
        strings::SubstituteAndAppend(contents, "$0 to $1, ", range->start,
                                  range->end - 1);
      }
    }
    contents->replace(contents->size() - 2, 2, ";\n");
  }

  if (reserved_name_count() > 0) {
    strings::SubstituteAndAppend(contents, "$0  reserved ", prefix);
    for (int i = 0; i < reserved_name_count(); i++) {
      strings::SubstituteAndAppend(contents, "\"$0\", ",
                                CEscape(reserved_name(i)));
    }
    contents->replace(contents->size() - 2, 2, ";\n");
  }

  strings::SubstituteAndAppend(contents, "$0}\n", prefix);
  comment_printer.AddPostComment(contents);
}